

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExporter.cpp
# Opt level: O0

void __thiscall Assimp::FBXExporter::WriteBinaryHeader(FBXExporter *this)

{
  element_type *peVar1;
  shared_ptr<Assimp::IOStream> local_70;
  undefined1 local_60 [8];
  StreamWriterLE outstream;
  char binary_header [24];
  FBXExporter *this_local;
  
  outstream.cursor._0_1_ = 'K';
  outstream.cursor._1_1_ = 'a';
  outstream.cursor._2_1_ = 'y';
  outstream.cursor._3_1_ = 'd';
  outstream.cursor._4_1_ = 'a';
  outstream.cursor._5_1_ = 'r';
  outstream.cursor._6_1_ = 'a';
  outstream.cursor._7_1_ = ' ';
  peVar1 = std::__shared_ptr_access<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->outfile);
  (*peVar1->_vptr_IOStream[3])(peVar1,&outstream.cursor,1,0x17);
  std::shared_ptr<Assimp::IOStream>::shared_ptr(&local_70,&this->outfile);
  StreamWriter<false,_false>::StreamWriter((StreamWriter<false,_false> *)local_60,&local_70,false);
  std::shared_ptr<Assimp::IOStream>::~shared_ptr(&local_70);
  StreamWriter<false,_false>::PutU4((StreamWriter<false,_false> *)local_60,0x1d4c);
  StreamWriter<false,_false>::~StreamWriter((StreamWriter<false,_false> *)local_60);
  return;
}

Assistant:

void FBXExporter::WriteBinaryHeader()
{
    // first a specific sequence of 23 bytes, always the same
    const char binary_header[24] = "Kaydara FBX Binary\x20\x20\x00\x1a\x00";
    outfile->Write(binary_header, 1, 23);

    // then FBX version number, "multiplied" by 1000, as little-endian uint32.
    // so 7.3 becomes 7300 == 0x841C0000, 7.4 becomes 7400 == 0xE81C0000, etc
    {
        StreamWriterLE outstream(outfile);
        outstream.PutU4(EXPORT_VERSION_INT);
    } // StreamWriter destructor writes the data to the file

    // after this the node data starts immediately
    // (probably with the FBXHEaderExtension node)
}